

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O1

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_idle_t *puVar3;
  uv_udp_send_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_40 [40];
  void *local_18;
  void *local_10;
  
  auStack_40._32_8_ = (void *)0x1dd60a;
  puVar2 = uv_default_loop();
  auStack_40._32_8_ = (void *)0x1dd619;
  iVar1 = uv_idle_init(puVar2,&idle_handle);
  local_10 = (void *)(long)iVar1;
  local_18 = (void *)0x0;
  if (local_10 == (void *)0x0) {
    auStack_40._32_8_ = (void *)0x1dd64f;
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001dd785;
    auStack_40._32_8_ = (void *)0x1dd672;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1dd681;
    iVar1 = uv_udp_init(puVar2,&client);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001dd792;
    auStack_40._32_8_ = (void *)0x1dd6b0;
    buf = uv_buf_init(send_data,0x400);
    auStack_40._32_8_ = (void *)0x1dd6d1;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001dd79f;
    auStack_40._32_8_ = (void *)0x1dd6f4;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1dd6fe;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (void *)(long)loop_hang_called;
    local_18 = (void *)0x3e8;
    if ((long)local_10 < 0x3e9) goto LAB_001dd7ac;
    auStack_40._32_8_ = (void *)0x1dd726;
    unaff_RBX = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1dd73a;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_40._32_8_ = (void *)0x1dd744;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_10 = (void *)0x0;
    auStack_40._32_8_ = (void *)0x1dd752;
    puVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1dd75a;
    iVar1 = uv_loop_close(puVar2);
    local_18 = (void *)(long)iVar1;
    if (local_10 == local_18) {
      auStack_40._32_8_ = (void *)0x1dd770;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._32_8_ = (void *)0x1dd785;
    run_test_udp_send_hang_loop_cold_1();
LAB_001dd785:
    auStack_40._32_8_ = (void *)0x1dd792;
    run_test_udp_send_hang_loop_cold_2();
LAB_001dd792:
    auStack_40._32_8_ = (void *)0x1dd79f;
    run_test_udp_send_hang_loop_cold_3();
LAB_001dd79f:
    auStack_40._32_8_ = (void *)0x1dd7ac;
    run_test_udp_send_hang_loop_cold_4();
LAB_001dd7ac:
    auStack_40._32_8_ = (void *)0x1dd7b9;
    run_test_udp_send_hang_loop_cold_5();
  }
  puVar3 = (uv_idle_t *)&stack0xfffffffffffffff0;
  auStack_40._32_8_ = idle_cb;
  run_test_udp_send_hang_loop_cold_6();
  if (send_req.handle == (uv_udp_t *)0x0) {
    if (puVar3 != &idle_handle) goto LAB_001dd8a2;
    auStack_40._8_8_ = (uv_loop_t *)0x1dd7f6;
    iVar1 = uv_idle_stop(&idle_handle);
    auStack_40._32_8_ = SEXT48(iVar1);
    auStack_40._24_8_ = (void *)0x0;
    if ((code *)auStack_40._32_8_ != (code *)0x0) goto LAB_001dd8a7;
    if (999 < loop_hang_called) {
      auStack_40._8_8_ = (uv_loop_t *)0x1dd83a;
      loop_hang_called = loop_hang_called + 1;
      uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&idle_handle,(uv_close_cb)0x0);
      return extraout_EAX;
    }
    auStack_40._8_8_ = (uv_loop_t *)0x1dd879;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,(sockaddr *)&addr,send_cb);
    auStack_40._32_8_ = SEXT48(iVar1);
    auStack_40._24_8_ = (void *)0x0;
    if ((code *)auStack_40._32_8_ == (code *)0x0) {
      return iVar1;
    }
  }
  else {
    auStack_40._8_8_ = (uv_loop_t *)0x1dd8a2;
    idle_cb_cold_1();
LAB_001dd8a2:
    auStack_40._8_8_ = (uv_loop_t *)0x1dd8a7;
    idle_cb_cold_2();
LAB_001dd8a7:
    auStack_40._8_8_ = (uv_loop_t *)0x1dd8b6;
    idle_cb_cold_3();
  }
  handle = (uv_udp_send_t *)(auStack_40 + 0x20);
  iVar1 = (int)auStack_40 + 0x18;
  auStack_40._8_8_ = send_cb;
  idle_cb_cold_4();
  auStack_40._8_8_ = unaff_RBX;
  if (handle == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
LAB_001dd92e:
    send_cb_cold_1();
LAB_001dd936:
    send_cb_cold_2();
  }
  else {
    if ((iVar1 != -0x65) && (iVar1 != 0)) goto LAB_001dd948;
    if (handle->handle != &client) goto LAB_001dd92e;
    if (handle != &send_req) goto LAB_001dd936;
    send_req.handle = (uv_udp_t *)0x0;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ == (void *)0x0) {
      return iVar1;
    }
  }
  handle = (uv_udp_send_t *)auStack_40;
  send_cb_cold_3();
LAB_001dd948:
  send_cb_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT_OK(uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/24 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT_OK(uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT_OK(uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_GT(loop_hang_called, 1000);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}